

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O2

FxExpression * ParseExpressionE(FScanner *sc,PClassActor *cls)

{
  int o;
  bool bVar1;
  FxExpression *l;
  FxExpression *r;
  FxExpression *this;
  PClassActor *size;
  int token;
  
  l = ParseExpressionD(sc,cls);
  while( true ) {
    bVar1 = FScanner::GetToken(sc);
    if ((!bVar1) || (o = sc->TokenType, 2 < o - 0x116U)) break;
    size = cls;
    r = ParseExpressionD(sc,cls);
    this = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)size);
    FxShift::FxShift((FxShift *)this,o,l,r);
    l = this;
  }
  if (sc->End == false) {
    FScanner::UnGet(sc);
  }
  return l;
}

Assistant:

static FxExpression *ParseExpressionE (FScanner &sc, PClassActor *cls)
{
	FxExpression *tmp = ParseExpressionD (sc, cls);

	while (sc.GetToken() && (sc.TokenType == TK_LShift || sc.TokenType == TK_RShift || sc.TokenType == TK_URShift))
	{
		int token = sc.TokenType;
		FxExpression *right = ParseExpressionD (sc, cls);
		tmp = new FxShift(token, tmp, right);
	}
	if (!sc.End) sc.UnGet();
	return tmp;
}